

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmseventreader.cpp
# Opt level: O3

void __thiscall QEglFSKmsEventReader::destroy(QEglFSKmsEventReader *this)

{
  QLoggingCategory *pQVar1;
  long in_FS_OFFSET;
  QDeadlineTimer QVar2;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_device != (QEglFSKmsDevice *)0x0) {
    pQVar1 = QtPrivateLogging::qLcEglfsKmsDebug();
    if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_18 = pQVar1->name;
      local_30[0] = '\x02';
      local_30[1] = '\0';
      local_30[2] = '\0';
      local_30[3] = '\0';
      local_30[4] = '\0';
      local_30[5] = '\0';
      local_30[6] = '\0';
      local_30[7] = '\0';
      local_30[8] = '\0';
      local_30[9] = '\0';
      local_30[10] = '\0';
      local_30[0xb] = '\0';
      local_30[0xc] = '\0';
      local_30[0xd] = '\0';
      local_30[0xe] = '\0';
      local_30[0xf] = '\0';
      local_30[0x10] = '\0';
      local_30[0x11] = '\0';
      local_30[0x12] = '\0';
      local_30[0x13] = '\0';
      local_30[0x14] = '\0';
      local_30[0x15] = '\0';
      local_30[0x16] = '\0';
      local_30[0x17] = '\0';
      QMessageLogger::debug(local_30,"Stopping event reader for device %p",this->m_device);
    }
    if (this->m_thread != (QEglFSKmsEventReaderThread *)0x0) {
      QThread::quit();
      QVar2.t2 = 0xffffffff;
      QVar2.type = 0x7fffffff;
      QVar2.t1 = (qint64)this->m_thread;
      QThread::wait(QVar2);
      if (this->m_thread != (QEglFSKmsEventReaderThread *)0x0) {
        (**(code **)(*(long *)this->m_thread + 0x20))();
      }
      this->m_thread = (QEglFSKmsEventReaderThread *)0x0;
    }
    this->m_device = (QEglFSKmsDevice *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSKmsEventReader::destroy()
{
    if (!m_device)
        return;

    qCDebug(qLcEglfsKmsDebug, "Stopping event reader for device %p", m_device);

    if (m_thread) {
        m_thread->quit();
        m_thread->wait();
        delete m_thread;
        m_thread = nullptr;
    }

    m_device = nullptr;
}